

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O2

Color __thiscall RoughConductorBRDF::f(RoughConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  undefined1 *a;
  EDX *a_00;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  float fVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float in_XMM1_Db;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vec3f vVar13;
  vec3f vVar14;
  vec3f vVar15;
  vec3f vVar16;
  vec3f vVar17;
  Color CVar18;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  vec3f local_108;
  float local_f8;
  float fStack_f4;
  undefined4 uStack_f0;
  float local_e8;
  undefined4 uStack_e0;
  float local_d8;
  float fStack_d4;
  undefined4 uStack_d0;
  float local_c8;
  undefined4 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uVar19;
  float fVar20;
  
  local_108 = operator+(wo,wi);
  vVar13 = normalized(&local_108);
  fVar1 = wo->z * vVar13.z + wo->x * vVar13.x + vVar13.y * wo->y;
  a_00 = (EDX *)&(this->super_BRDF).field_0x8;
  vVar14 = operator*((vec3f *)a_00,(vec3f *)a_00);
  local_48 = vVar14._0_8_;
  a = &(this->super_BRDF).field_0x14;
  uStack_40 = extraout_XMM0_Qb;
  vVar15 = operator*((vec3f *)a,(vec3f *)a);
  local_58 = vVar15._0_8_;
  fVar2 = fVar1 * fVar1;
  fVar6 = in_XMM1_Db;
  uStack_50 = extraout_XMM0_Qb_00;
  vVar16 = operator*(2.0,(vec3f *)a_00);
  local_d8 = vVar16.z;
  local_78 = vVar16._0_8_;
  uStack_d0 = 0;
  fStack_d4 = fVar6;
  uStack_70 = extraout_XMM0_Qb_01;
  vVar16 = operator*(2.0,(vec3f *)a_00);
  local_68 = vVar16._0_8_;
  local_c8 = vVar16.z * fVar1;
  uStack_c0 = 0;
  uStack_60 = extraout_XMM0_Qb_02;
  vVar16 = operator*((vec3f *)a_00,(vec3f *)a_00);
  local_88 = vVar16._0_8_;
  uStack_80 = extraout_XMM0_Qb_03;
  vVar17 = operator*((vec3f *)a,(vec3f *)a);
  local_98 = vVar17._0_8_;
  local_e8 = vVar17.z + vVar16.z;
  uStack_e0 = 0;
  uStack_90 = extraout_XMM0_Qb_04;
  vVar16 = operator*(2.0,(vec3f *)a_00);
  local_f8 = vVar16.z;
  uStack_f0 = 0;
  fStack_f4 = fVar6;
  vVar17 = operator*(2.0,(vec3f *)a_00);
  local_a8 = vVar17._0_8_;
  fVar3 = (vVar15.z + vVar14.z) * fVar2;
  in_XMM1_Db = in_XMM1_Db * 0.0;
  fVar6 = fVar6 * 0.0;
  auVar4._0_4_ = (fVar3 - local_d8 * fVar1) + 1.0;
  auVar4._4_4_ = (local_e8 - local_f8 * fVar1) + fVar2;
  auVar4._8_4_ = (in_XMM1_Db - fStack_d4 * fVar1) + 0.0;
  auVar4._12_4_ = (fVar6 - fStack_f4 * fVar1) + 0.0;
  auVar5._4_4_ = local_e8 + vVar17.z * fVar1 + fVar2;
  auVar5._0_4_ = local_c8 + fVar3 + 1.0;
  auVar5._8_4_ = in_XMM1_Db + in_XMM1_Db + 0.0;
  auVar5._12_4_ = fVar6 + fVar6 + 0.0;
  auVar5 = divps(auVar4,auVar5);
  local_b8 = fVar1;
  fStack_b4 = fVar1;
  fStack_b0 = fVar1;
  fStack_ac = fVar1;
  uStack_a0 = extraout_XMM0_Qb_06;
  fVar6 = EDX::GGX_D(a_00,vVar13,this->alpha);
  fVar1 = EDX::Smith_G(*wo,*wi,vVar13,this->alpha);
  fVar6 = (fVar1 * fVar6) / (wo->z * 4.0 * wi->z);
  fVar1 = ((float)local_58 + (float)local_48) * fVar2;
  fVar3 = (local_58._4_4_ + local_48._4_4_) * fVar2;
  fVar11 = ((float)uStack_50 + (float)uStack_40) * fVar2;
  fVar12 = (uStack_50._4_4_ + uStack_40._4_4_) * fVar2;
  auVar7._0_4_ = (fVar1 - (float)local_78 * local_b8) + 1.0;
  auVar7._4_4_ = (fVar3 - local_78._4_4_ * fStack_b4) + 1.0;
  auVar7._8_4_ = (fVar11 - (float)uStack_70 * fStack_b0) + 0.0;
  auVar7._12_4_ = (fVar12 - uStack_70._4_4_ * fStack_ac) + 0.0;
  auVar8._4_4_ = local_68._4_4_ * fStack_b4 + fVar3 + 1.0;
  auVar8._0_4_ = (float)local_68 * local_b8 + fVar1 + 1.0;
  auVar8._8_4_ = (float)uStack_60 * fStack_b0 + fVar11 + 0.0;
  auVar8._12_4_ = uStack_60._4_4_ * fStack_ac + fVar12 + 0.0;
  auVar8 = divps(auVar7,auVar8);
  local_138 = vVar16.x;
  fStack_134 = vVar16.y;
  fStack_130 = (float)extraout_XMM0_Qb_05;
  fStack_12c = (float)((ulong)extraout_XMM0_Qb_05 >> 0x20);
  auVar9._0_4_ = (((float)local_98 + (float)local_88) - local_138 * local_b8) + fVar2;
  auVar9._4_4_ = ((local_98._4_4_ + local_88._4_4_) - fStack_134 * fStack_b4) + fVar2;
  auVar9._8_4_ = (((float)uStack_90 + (float)uStack_80) - fStack_130 * fStack_b0) + fVar2;
  auVar9._12_4_ = ((uStack_90._4_4_ + uStack_80._4_4_) - fStack_12c * fStack_ac) + fVar2;
  auVar10._4_4_ = fStack_b4 * local_a8._4_4_ + local_98._4_4_ + local_88._4_4_ + fVar2;
  auVar10._0_4_ = local_b8 * (float)local_a8 + (float)local_98 + (float)local_88 + fVar2;
  auVar10._8_4_ = fStack_b0 * (float)uStack_a0 + (float)uStack_90 + (float)uStack_80 + fVar2;
  auVar10._12_4_ = fStack_ac * uStack_a0._4_4_ + uStack_90._4_4_ + uStack_80._4_4_ + fVar2;
  auVar10 = divps(auVar9,auVar10);
  local_108.y = fVar6 * (auVar10._4_4_ + auVar8._4_4_) * 0.5;
  local_108.x = fVar6 * (auVar10._0_4_ + auVar8._0_4_) * 0.5;
  local_108.z = (auVar5._4_4_ + auVar5._0_4_) * 0.5 * fVar6;
  vVar13 = operator*(&local_108,albedo);
  CVar18.x = vVar13.x;
  uVar19._4_4_ = vVar13.y;
  register0x00001240 = vVar13.z;
  return CVar18;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const override
	{
		vec3f wm = normalized(wo+wi); // microfacet normal
		float cos = dot(wm,wo);
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		Color Fres = 0.5 * (r1 + r2); // reflected energy
		return EDX::GGX_D(wm,alpha) * EDX::Smith_G(wo,wi,wm,alpha) / (4 * wo.z * wi.z) * Fres * albedo;
	}